

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

void __thiscall soul::FunctionBuilder::endFunction(FunctionBuilder *this)

{
  Function *pFVar1;
  
  if ((this->currentFunction).object != (Function *)0x0) {
    pFVar1 = pool_ptr<soul::heart::Function>::operator->(&this->currentFunction);
    if ((pFVar1->blocks).
        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pFVar1->blocks).
        super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pFVar1 = pool_ptr<soul::heart::Function>::operator->(&this->currentFunction);
      ((pFVar1->blocks).
       super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->object->doNotOptimiseAway = true;
    }
  }
  (this->super_BlockBuilder).currentBlock.object = (Block *)0x0;
  (this->super_BlockBuilder).lastStatementInCurrentBlock.object = (Statement *)0x0;
  return;
}

Assistant:

void endFunction()
    {
        if (currentFunction != nullptr)
            if (! currentFunction->blocks.empty())
                currentFunction->blocks.front()->doNotOptimiseAway = true;

        currentBlock = {};
        lastStatementInCurrentBlock = {};
    }